

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O1

int Fxch_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nMaxDivExt,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Que_t *pVVar3;
  int *piVar4;
  int *piVar5;
  float *pfVar6;
  Vec_Wec_t *pVVar7;
  int iVar8;
  Fxch_Man_t *pFxchMan;
  long lVar9;
  long lVar10;
  Fxch_Man_t *pFVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  timespec ts;
  timespec local_58;
  int local_44;
  long local_40;
  Vec_Wec_t *local_38;
  
  local_38 = vCubes;
  pFxchMan = Fxch_ManAlloc(vCubes);
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  Fxch_CubesGruping(pFxchMan);
  Fxch_ManMapLiteralsIntoCubes(pFxchMan,ObjIdMax);
  Fxch_ManGenerateLitHashKeys(pFxchMan);
  Fxch_ManComputeLevel(pFxchMan);
  Fxch_ManSCHashTablesInit(pFxchMan);
  Fxch_ManDivCreate(pFxchMan);
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  pFxchMan->timeInit = lVar10 + lVar9;
  if (fVeryVerbose != 0) {
    Fxch_ManPrintDivs(pFxchMan);
  }
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan);
  }
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    local_40 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_40 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  local_44 = fVerbose;
  if (-1 < nMaxDivExt) {
    iVar8 = 0;
    do {
      pVVar3 = pFxchMan->vDivPrio;
      iVar1 = pVVar3->nSize;
      if (iVar1 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      fVar17 = -1e+09;
      if (iVar1 != 1) {
        if (*pVVar3->pCostsFlt == (float *)0x0) {
          fVar17 = (float)pVVar3->pHeap[1];
        }
        else {
          fVar17 = (*pVVar3->pCostsFlt)[pVVar3->pHeap[1]];
        }
      }
      if (fVar17 <= 0.0) break;
      if (iVar1 == 1) {
        __assert_fail("p->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xed,"int Vec_QuePop(Vec_Que_t *)");
      }
      piVar4 = pVVar3->pHeap;
      piVar5 = pVVar3->pOrder;
      iVar1 = piVar4[1];
      piVar5[iVar1] = -1;
      iVar12 = pVVar3->nSize;
      pVVar3->nSize = iVar12 + -1;
      if (iVar12 + -1 == 1) {
        piVar4[1] = -1;
      }
      else {
        iVar2 = piVar4[(long)iVar12 + -1];
        piVar4[(long)iVar12 + -1] = -1;
        piVar4[1] = iVar2;
        piVar5[iVar2] = 1;
        pfVar6 = *pVVar3->pCostsFlt;
        if (pfVar6 == (float *)0x0) {
          fVar17 = (float)iVar2;
        }
        else {
          fVar17 = pfVar6[iVar2];
        }
        iVar12 = pVVar3->nSize;
        uVar15 = 1;
        if (2 < iVar12) {
          uVar13 = 2;
          uVar15 = 1;
          do {
            uVar16 = uVar13 | 1;
            uVar14 = uVar13;
            if ((int)uVar16 < iVar12) {
              if (pfVar6 == (float *)0x0) {
                fVar18 = (float)piVar4[(int)uVar13];
              }
              else {
                fVar18 = pfVar6[piVar4[(int)uVar13]];
              }
              if (pfVar6 == (float *)0x0) {
                fVar19 = (float)piVar4[(int)uVar16];
              }
              else {
                fVar19 = pfVar6[piVar4[(int)uVar16]];
              }
              if (fVar18 < fVar19) {
                uVar14 = uVar16;
              }
            }
            if (iVar12 <= (int)uVar14) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar12 = piVar4[(int)uVar14];
            if (pfVar6 == (float *)0x0) {
              fVar18 = (float)iVar12;
            }
            else {
              fVar18 = pfVar6[iVar12];
            }
            if (fVar18 <= fVar17) break;
            piVar4[(int)uVar15] = iVar12;
            piVar5[iVar12] = uVar15;
            uVar13 = uVar14 * 2;
            iVar12 = pVVar3->nSize;
            uVar15 = uVar14;
          } while ((int)uVar13 < iVar12);
        }
        piVar4[(int)uVar15] = iVar2;
        piVar5[iVar2] = uVar15;
      }
      if (fVeryVerbose != 0) {
        Fxch_DivPrint(pFxchMan,iVar1);
      }
      Fxch_ManUpdate(pFxchMan,iVar1);
      iVar8 = iVar8 + 1;
    } while (iVar8 < nMaxDivExt || nMaxDivExt == 0);
  }
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  pFxchMan->timeExt = lVar9 + local_40;
  if (local_44 != 0) {
    pFVar11 = pFxchMan;
    Fxch_ManPrintStats(pFxchMan);
    lVar9 = pFxchMan->timeExt;
    lVar10 = pFxchMan->timeInit;
    iVar8 = (int)pFVar11;
    Abc_Print(iVar8,"%s =","\n[FXCH] Elapsed Time");
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar9 + lVar10) / 1000000.0);
    lVar9 = pFxchMan->timeInit;
    Abc_Print(iVar8,"%s =","[FXCH]    +-> Init");
    Abc_Print(iVar8,"%9.2f sec\n",(double)lVar9 / 1000000.0);
    lVar9 = pFxchMan->timeExt;
    Abc_Print(iVar8,"%s =","[FXCH]    +-> Extr");
    Abc_Print(iVar8,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  }
  Fxch_CubesUnGruping(pFxchMan);
  Fxch_ManSCHashTablesFree(pFxchMan);
  Fxch_ManFree(pFxchMan);
  pVVar7 = local_38;
  Vec_WecRemoveEmpty(local_38);
  qsort(pVVar7->pArray,(long)pVVar7->nSize,0x10,Vec_WecSortCompare3);
  return 1;
}

Assistant:

int Fxch_FastExtract( Vec_Wec_t* vCubes,
                      int ObjIdMax,
                      int nMaxDivExt,
                      int fVerbose,
                      int fVeryVerbose )
{
    abctime TempTime;
    Fxch_Man_t* pFxchMan = Fxch_ManAlloc( vCubes );
    int i;

    TempTime = Abc_Clock();
    Fxch_CubesGruping( pFxchMan );
    Fxch_ManMapLiteralsIntoCubes( pFxchMan, ObjIdMax );
    Fxch_ManGenerateLitHashKeys( pFxchMan );
    Fxch_ManComputeLevel( pFxchMan );
    Fxch_ManSCHashTablesInit( pFxchMan );
    Fxch_ManDivCreate( pFxchMan );
    pFxchMan->timeInit = Abc_Clock() - TempTime;

    if ( fVeryVerbose )
        Fxch_ManPrintDivs( pFxchMan );

    if ( fVerbose )
        Fxch_ManPrintStats( pFxchMan );

    TempTime = Abc_Clock();
    
    for ( i = 0; (!nMaxDivExt || i < nMaxDivExt) && Vec_QueTopPriority( pFxchMan->vDivPrio ) > 0.0; i++ )
    {
        int iDiv = Vec_QuePop( pFxchMan->vDivPrio );

        if ( fVeryVerbose )
            Fxch_DivPrint( pFxchMan, iDiv );

        Fxch_ManUpdate( pFxchMan, iDiv );
    }
   
    pFxchMan->timeExt = Abc_Clock() - TempTime;

    if ( fVerbose )
    {
        Fxch_ManPrintStats( pFxchMan );
        Abc_PrintTime( 1, "\n[FXCH] Elapsed Time", pFxchMan->timeInit + pFxchMan->timeExt );
        Abc_PrintTime( 1, "[FXCH]    +-> Init", pFxchMan->timeInit );
        Abc_PrintTime( 1, "[FXCH]    +-> Extr", pFxchMan->timeExt );
    }

    Fxch_CubesUnGruping( pFxchMan );
    Fxch_ManSCHashTablesFree( pFxchMan );
    Fxch_ManFree( pFxchMan );

    Vec_WecRemoveEmpty( vCubes );
    Vec_WecSortByFirstInt( vCubes, 0 );

    return 1;
}